

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuObjIterCacheIndexedCols(sqlite3rbu *p,RbuObjIter *pIter)

{
  sqlite3 *psVar1;
  int iVar2;
  u8 **ppuVar3;
  char *pcVar4;
  bool bVar5;
  sqlite3_stmt *psStack_40;
  int iCid;
  sqlite3_stmt *pXInfo;
  uchar *puStack_30;
  int bPartial;
  char *zIdx;
  sqlite3_stmt *psStack_20;
  int bIndex;
  sqlite3_stmt *pList;
  RbuObjIter *pIter_local;
  sqlite3rbu *p_local;
  
  psStack_20 = (sqlite3_stmt *)0x0;
  zIdx._4_4_ = 0;
  pList = (sqlite3_stmt *)pIter;
  pIter_local = (RbuObjIter *)p;
  if (p->rc == 0) {
    memcpy(pIter->abIndexed,pIter->abTblPk,(long)pIter->nTblCol);
    psVar1 = (sqlite3 *)pIter_local->pIdxIter;
    ppuVar3 = &pIter_local->abIndexed;
    pcVar4 = sqlite3_mprintf("PRAGMA main.index_list = %Q",*(undefined8 *)(pList + 0x50));
    iVar2 = prepareFreeAndCollectError(psVar1,&stack0xffffffffffffffe0,(char **)ppuVar3,pcVar4);
    *(int *)&pIter_local->abNotNull = iVar2;
  }
  *(undefined4 *)(pList + 0x74) = 0;
  while( true ) {
    bVar5 = false;
    if (*(int *)&pIter_local->abNotNull == 0) {
      iVar2 = sqlite3_step(psStack_20);
      bVar5 = iVar2 == 100;
    }
    if (!bVar5) break;
    puStack_30 = sqlite3_column_text(psStack_20,1);
    pXInfo._4_4_ = sqlite3_column_int(psStack_20,4);
    psStack_40 = (sqlite3_stmt *)0x0;
    if (puStack_30 == (uchar *)0x0) break;
    if (pXInfo._4_4_ != 0) {
      memset(*(void **)(pList + 0x40),1,(long)*(int *)(pList + 0x10));
    }
    psVar1 = (sqlite3 *)pIter_local->pIdxIter;
    ppuVar3 = &pIter_local->abIndexed;
    pcVar4 = sqlite3_mprintf("PRAGMA main.index_xinfo = %Q",puStack_30);
    iVar2 = prepareFreeAndCollectError(psVar1,&stack0xffffffffffffffc0,(char **)ppuVar3,pcVar4);
    *(int *)&pIter_local->abNotNull = iVar2;
    while( true ) {
      bVar5 = false;
      if (*(int *)&pIter_local->abNotNull == 0) {
        iVar2 = sqlite3_step(psStack_40);
        bVar5 = iVar2 == 100;
      }
      if (!bVar5) break;
      iVar2 = sqlite3_column_int(psStack_40,1);
      if (-1 < iVar2) {
        *(undefined1 *)(*(long *)(pList + 0x40) + (long)iVar2) = 1;
      }
    }
    rbuFinalize((sqlite3rbu *)pIter_local,psStack_40);
    zIdx._4_4_ = 1;
    *(int *)(pList + 0x74) = *(int *)(pList + 0x74) + 1;
  }
  if (*(int *)(pList + 0x48) == 4) {
    *(int *)(pList + 0x74) = *(int *)(pList + 0x74) + -1;
  }
  rbuFinalize((sqlite3rbu *)pIter_local,psStack_20);
  if (zIdx._4_4_ == 0) {
    *(undefined8 *)(pList + 0x40) = 0;
  }
  return;
}

Assistant:

static void rbuObjIterCacheIndexedCols(sqlite3rbu *p, RbuObjIter *pIter){
  sqlite3_stmt *pList = 0;
  int bIndex = 0;

  if( p->rc==SQLITE_OK ){
    memcpy(pIter->abIndexed, pIter->abTblPk, sizeof(u8)*pIter->nTblCol);
    p->rc = prepareFreeAndCollectError(p->dbMain, &pList, &p->zErrmsg,
        sqlite3_mprintf("PRAGMA main.index_list = %Q", pIter->zTbl)
    );
  }

  pIter->nIndex = 0;
  while( p->rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pList) ){
    const char *zIdx = (const char*)sqlite3_column_text(pList, 1);
    int bPartial = sqlite3_column_int(pList, 4);
    sqlite3_stmt *pXInfo = 0;
    if( zIdx==0 ) break;
    if( bPartial ){
      memset(pIter->abIndexed, 0x01, sizeof(u8)*pIter->nTblCol);
    }
    p->rc = prepareFreeAndCollectError(p->dbMain, &pXInfo, &p->zErrmsg,
        sqlite3_mprintf("PRAGMA main.index_xinfo = %Q", zIdx)
    );
    while( p->rc==SQLITE_OK && SQLITE_ROW==sqlite3_step(pXInfo) ){
      int iCid = sqlite3_column_int(pXInfo, 1);
      if( iCid>=0 ) pIter->abIndexed[iCid] = 1;
    }
    rbuFinalize(p, pXInfo);
    bIndex = 1;
    pIter->nIndex++;
  }

  if( pIter->eType==RBU_PK_WITHOUT_ROWID ){
    /* "PRAGMA index_list" includes the main PK b-tree */
    pIter->nIndex--;
  }

  rbuFinalize(p, pList);
  if( bIndex==0 ) pIter->abIndexed = 0;
}